

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::get_unit(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  undefined4 uVar2;
  precise_unit pVar3;
  precise_unit pVar4;
  bool bVar5;
  int iVar6;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  _Var8;
  const_iterator cVar9;
  precise_unit *ppVar10;
  long lVar11;
  unit_data uVar7;
  size_t *index;
  ulong index_00;
  precise_unit pVar12;
  precise_unit pVar13;
  precise_unit actUnit;
  uint64_t h1;
  char *ptr;
  
  if ((((_ZN5unitsL21allowUserDefinedUnitsE_0 & 1) != 0) &&
      (user_defined_units_abi_cxx11_._24_8_ != 0)) &&
     (_Var8._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)user_defined_units_abi_cxx11_,unit_string),
     _Var8._M_cur != (__node_type *)0x0)) {
LAB_0031c0b1:
    return *(precise_unit *)
            ((long)&((_Var8._M_cur)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
                    ._M_storage._M_storage + 0x20);
  }
  index_00 = match_flags & 0xff;
  if ((match_flags & 0xff) == 0) {
    index_00 = unitsDomain;
  }
  if (index_00 != 0) {
    h1 = hashGen(index_00,unit_string);
    cVar9 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_units::precise_unit>,_std::allocator<std::pair<const_unsigned_long,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_units::precise_unit>,_std::allocator<std::pair<const_unsigned_long,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)domainSpecificUnit,&h1);
    ppVar10 = (precise_unit *)&precise::invalid;
    if (cVar9.super__Node_iterator_base<std::pair<const_unsigned_long,_units::precise_unit>,_false>.
        _M_cur != (__node_type *)0x0) {
      ppVar10 = (precise_unit *)
                ((long)cVar9.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_units::precise_unit>,_false>
                       ._M_cur + 0x10);
    }
    uVar2 = ppVar10->base_units_;
    if (uVar2 != -0x56b5b78 || !NAN(ppVar10->multiplier_)) {
      return *ppVar10;
    }
  }
  _Var8._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)base_unit_vals_abi_cxx11_,unit_string);
  if (_Var8._M_cur != (__node_type *)0x0) goto LAB_0031c0b1;
  cVar1 = *(unit_string->_M_dataplus)._M_p;
  pVar3.base_units_ = (unit_data)0xfa94a488;
  pVar3.commodity_ = 0;
  pVar3.multiplier_ = NAN;
  pVar13.base_units_ = (unit_data)0xfa94a488;
  pVar13.commodity_ = 0;
  pVar13.multiplier_ = NAN;
  if ((cVar1 != 'E') && (cVar1 != 'C')) {
    return pVar13;
  }
  if (unit_string->_M_string_length < 6) {
    return pVar3;
  }
  iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,5,"CXUN[");
  if ((iVar6 == 0) && (bVar5 = hasAdditionalOps(unit_string), !bVar5)) {
    ptr = (char *)0x0;
    lVar11 = strtol((unit_string->_M_dataplus)._M_p + 5,&ptr,0);
    if (*ptr == ']') {
      index = (size_t *)ptr;
      pVar12 = precise::generate_custom_unit((uint16_t)lVar11);
      goto LAB_0031c1f3;
    }
  }
  iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,6,"CXCUN[");
  if ((iVar6 == 0) && (bVar5 = hasAdditionalOps(unit_string), !bVar5)) {
    ptr = (char *)0x0;
    lVar11 = strtol((unit_string->_M_dataplus)._M_p + 6,&ptr,0);
    if (*ptr == ']') {
      index = (size_t *)ptr;
      pVar12 = precise::generate_custom_count_unit((uint16_t)lVar11);
      goto LAB_0031c1f3;
    }
  }
  iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,6,"EQXUN[");
  if ((iVar6 == 0) && (bVar5 = hasAdditionalOps(unit_string), !bVar5)) {
    ptr = (char *)0x0;
    lVar11 = strtol((unit_string->_M_dataplus)._M_p + 6,&ptr,0);
    if (*ptr == ']') {
      index = (size_t *)ptr;
      uVar7 = precise::custom::equation_unit((uint16_t)lVar11);
      pVar12.base_units_ = uVar7;
      pVar12.multiplier_ = 1.0;
      pVar12.commodity_ = 0;
LAB_0031c1f3:
      actUnit.multiplier_ = pVar12.multiplier_;
      actUnit._8_8_ = &h1;
      pVar13 = commoditizedUnit((units *)unit_string,pVar12._8_8_,actUnit,index);
      return pVar13;
    }
  }
  pVar4.base_units_ = (unit_data)0xfa94a488;
  pVar4.commodity_ = 0;
  pVar4.multiplier_ = NAN;
  return pVar4;
}

Assistant:

static precise_unit
    get_unit(const std::string& unit_string, std::uint64_t match_flags)
{
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_units.empty()) {
            auto fnd2 = user_defined_units.find(unit_string);
            if (fnd2 != user_defined_units.end()) {
                return fnd2->second;
            }
        }
    }

    auto cdomain = getCurrentDomain(match_flags);
    if (cdomain != domains::defaultDomain) {
        auto dmunit = getDomainUnit(cdomain, unit_string);
        if (is_valid(dmunit)) {
            return dmunit;
        }
    }

    auto fnd = base_unit_vals.find(unit_string);
    if (fnd != base_unit_vals.end()) {
        return fnd->second;
    }
    // empty string would have been found already
    auto c = unit_string.front();
    if ((c == 'C' || c == 'E') && unit_string.size() >= 6) {
        size_t index{0};
        if (unit_string.compare(0, 5, "CXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 5, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string, precise::generate_custom_unit(num), index);
                }
            }
        }
        if (unit_string.compare(0, 6, "CXCUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise::generate_custom_count_unit(num),
                        index);
                }
            }
        }
        if (unit_string.compare(0, 6, "EQXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise_unit(precise::custom::equation_unit(num)),
                        index);
                }
            }
        }
    }
    return precise::invalid;
}